

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O3

int ffpi4b(fitsfile *fptr,long nvals,long incre,int *values,int *status)

{
  ffswap4(values,nvals);
  if (incre == 4) {
    ffpbyt(fptr,nvals << 2,values,status);
  }
  else {
    ffpbytoff(fptr,4,nvals,incre + -4,values,status);
  }
  return *status;
}

Assistant:

int ffpi4b(fitsfile *fptr, /* I - FITS file pointer                         */
           long nvals,     /* I - number of pixels in the values array      */
           long incre,     /* I - byte increment between pixels             */
           INT32BIT *values, /* I - array of values to write                */
           int *status)    /* IO - error status                             */
/*
  put (write) the array of values to the FITS file, doing machine dependent
  format conversion (e.g. byte-swapping) if necessary.
*/
{
#if BYTESWAPPED
    ffswap4(values, nvals);    /* reverse order of bytes in each value */
#endif

    if (incre == 4)      /* write all the values at once (contiguous bytes) */

        ffpbyt(fptr, nvals * 4, values, status);

    else         /* have to write each value individually (not contiguous ) */

        ffpbytoff(fptr, 4, nvals, incre - 4, values, status);

    return(*status);
}